

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

bool __thiscall AActor::FixMapthingPos(AActor *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  sector_t *psVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  bool bVar8;
  sector_t *psVar9;
  long lVar10;
  PClass *pPVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  int *piVar16;
  line_t *plVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  DAngle ang;
  undefined4 local_98;
  TAngle<double> local_88;
  double dStack_80;
  divline_t local_78;
  undefined1 local_58 [40];
  
  dVar2 = (this->__Pos).X;
  dVar3 = (this->__Pos).Y;
  psVar9 = P_PointInSectorBuggy(dVar2,dVar3);
  uVar14 = (uint)((dVar2 - bmaporgx) * 0.0078125);
  if ((uVar14 < (uint)bmapwidth) &&
     (uVar13 = (uint)((dVar3 - bmaporgy) * 0.0078125), uVar13 < (uint)bmapheight)) {
    piVar16 = blockmaplump + blockmap[(int)(bmapwidth * uVar13 + uVar14)];
    bVar15 = false;
    while( true ) {
      piVar16 = piVar16 + 1;
      lVar10 = (long)*piVar16;
      if (lVar10 == -1) break;
      psVar4 = lines[lVar10].backsector;
      if ((lines[lVar10].frontsector != psVar4) &&
         (((plVar17 = lines + lVar10, psVar4 == (sector_t *)0x0 ||
           (bVar8 = secplane_t::operator==
                              (&(lines[lVar10].frontsector)->floorplane,&psVar4->floorplane), !bVar8
           )) || (bVar8 = secplane_t::operator==
                                    (&plVar17->frontsector->ceilingplane,
                                     &plVar17->backsector->ceilingplane), !bVar8)))) {
        dVar2 = (this->__Pos).X;
        dVar3 = this->radius;
        if ((((plVar17->bbox[2] < dVar2 + dVar3) && (dVar2 - dVar3 < plVar17->bbox[3])) &&
            (dVar2 = (this->__Pos).Y, plVar17->bbox[1] < dVar3 + dVar2)) &&
           (dVar2 - dVar3 < plVar17->bbox[0])) {
          local_78.x = (plVar17->delta).X;
          local_78.y = (plVar17->delta).Y;
          dVar2 = TVector2<double>::Length((TVector2<double> *)&local_78);
          local_78.x = (plVar17->v1->p).X;
          local_78.y = (plVar17->v1->p).Y;
          local_78.dx = (plVar17->delta).X;
          local_78.dy = (plVar17->delta).Y;
          local_58._0_8_ = (this->__Pos).X;
          local_58._8_8_ = (this->__Pos).Y;
          auVar20._8_8_ = -local_78.dx;
          auVar20._0_8_ = local_78.dy;
          auVar5._8_4_ = SUB84(dVar2,0);
          auVar5._0_8_ = dVar2;
          auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
          local_58._16_16_ = divpd(auVar20,auVar5);
          dVar2 = P_InterceptVector((divline_t *)local_58,&local_78);
          dVar2 = ABS(dVar2);
          if (dVar2 < this->radius) {
            pPVar11 = DObject::GetClass((DObject *)this);
            dVar3 = (plVar17->delta).X;
            pcVar12 = "vertical";
            if ((dVar3 != 0.0) || (NAN(dVar3))) {
              pdVar1 = &(plVar17->delta).Y;
              pcVar12 = "horizontal";
              if (*pdVar1 != 0.0) {
                pcVar12 = "diagonal";
              }
              if (NAN(*pdVar1)) {
                pcVar12 = "diagonal";
              }
            }
            local_98 = SUB84(dVar2,0);
            DPrintf(3,"%s at (%f,%f) lies on %s line %td, distance = %f\n",SUB84((this->__Pos).X,0),
                    (this->__Pos).Y,local_98,
                    FName::NameData.NameArray
                    [(pPVar11->super_PStruct).super_PNamedType.TypeName.Index].Text,pcVar12,
                    ((long)plVar17 - (long)lines) / 0x98);
            local_88.Degrees = (plVar17->delta).X;
            dStack_80 = (plVar17->delta).Y;
            TVector2<double>::Angle((TVector2<double> *)&ang);
            if (plVar17->backsector == (sector_t *)0x0) {
              uVar18 = 0;
              uVar19 = 0xc0568000;
            }
            else {
              uVar18 = (undefined4)
                       *(undefined8 *)(&DAT_00694b30 + (ulong)(plVar17->backsector == psVar9) * 8);
              uVar19 = (undefined4)
                       ((ulong)*(undefined8 *)
                                (&DAT_00694b30 + (ulong)(plVar17->backsector == psVar9) * 8) >> 0x20
                       );
            }
            ang.Degrees = (double)CONCAT44(uVar19,uVar18) + ang.Degrees;
            dVar3 = (this->__Pos).X;
            dVar7 = (this->__Pos).Y;
            TAngle<double>::ToVector(&local_88,this->radius - dVar2);
            dVar3 = dVar3 + local_88.Degrees;
            dVar7 = dVar7 + dStack_80;
            auVar6._8_4_ = SUB84(dVar7,0);
            auVar6._0_8_ = dVar3;
            auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
            (this->__Pos).X = dVar3;
            (this->__Pos).Y = (double)auVar6._8_8_;
            ClearInterpolation(this);
            bVar15 = true;
          }
        }
      }
    }
    return bVar15;
  }
  return false;
}

Assistant:

bool AActor::FixMapthingPos()
{
	sector_t *secstart = P_PointInSectorBuggy(X(), Y());

	int blockx = GetBlockX(X());
	int blocky = GetBlockY(Y());
	bool success = false;

	if ((unsigned int)blockx < (unsigned int)bmapwidth &&
		(unsigned int)blocky < (unsigned int)bmapheight)
	{
		int *list;

		for (list = blockmaplump + blockmap[blocky*bmapwidth + blockx] + 1; *list != -1; ++list)
		{
			line_t *ldef = &lines[*list];

			if (ldef->frontsector == ldef->backsector)
			{ // Skip two-sided lines inside a single sector
				continue;
			}
			if (ldef->backsector != NULL)
			{
				if (ldef->frontsector->floorplane == ldef->backsector->floorplane &&
					ldef->frontsector->ceilingplane == ldef->backsector->ceilingplane)
				{ // Skip two-sided lines without any height difference on either side
					continue;
				}
			}

			// Not inside the line's bounding box
			if (X() + radius <= ldef->bbox[BOXLEFT]
				|| X() - radius >= ldef->bbox[BOXRIGHT]
				|| Y() + radius <= ldef->bbox[BOXBOTTOM]
				|| Y() - radius >= ldef->bbox[BOXTOP])
				continue;

			// Get the exact distance to the line
			divline_t dll, dlv;
			double linelen = ldef->Delta().Length();

			P_MakeDivline(ldef, &dll);

			dlv.x = X();
			dlv.y = Y();
			dlv.dx = dll.dy / linelen;
			dlv.dy = -dll.dx / linelen;

			double distance = fabs(P_InterceptVector(&dlv, &dll));

			if (distance < radius)
			{
				DPrintf(DMSG_NOTIFY, "%s at (%f,%f) lies on %s line %td, distance = %f\n",
					this->GetClass()->TypeName.GetChars(), X(), Y(),
					ldef->Delta().X == 0 ? "vertical" : ldef->Delta().Y == 0 ? "horizontal" : "diagonal",
					ldef - lines, distance);
				DAngle ang = ldef->Delta().Angle();
				if (ldef->backsector != NULL && ldef->backsector == secstart)
				{
					ang += 90.;
				}
				else
				{
					ang -= 90.;
				}

				// Get the distance we have to move the object away from the wall
				distance = radius - distance;
				SetXY(Pos().XY() + ang.ToVector(distance));
				ClearInterpolation();
				success = true;
			}
		}
	}
	return success;
}